

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O0

void __thiscall
wabt::(anonymous_namespace)::CWriter::
Write<char_const(&)[6],wabt::(anonymous_namespace)::ExternalInstanceRef,char_const(&)[7],wabt::(anonymous_namespace)::StackVar,char_const(&)[23],wabt::(anonymous_namespace)::OpenBrace>
          (CWriter *this,char (*t) [6],ExternalInstanceRef *u,char (*args) [7],StackVar *args_1,
          char (*args_2) [23],OpenBrace *args_3)

{
  string_view local_48;
  char (*local_38) [23];
  char (*args_local_2) [23];
  StackVar *args_local_1;
  char (*args_local) [7];
  ExternalInstanceRef *u_local;
  char (*t_local) [6];
  CWriter *this_local;
  
  local_38 = args_2;
  args_local_2 = (char (*) [23])args_1;
  args_local_1 = (StackVar *)args;
  args_local = (char (*) [7])u;
  u_local = (ExternalInstanceRef *)t;
  t_local = (char (*) [6])this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_48,*t);
  anon_unknown_0::CWriter::Write((CWriter *)this,local_48);
  anon_unknown_0::CWriter::Write((CWriter *)this,(ExternalInstanceRef *)args_local);
  Write<char_const(&)[7],wabt::(anonymous_namespace)::StackVar,char_const(&)[23],wabt::(anonymous_namespace)::OpenBrace>
            (this,(char (*) [7])args_local_1,(StackVar *)args_local_2,local_38,args_3);
  return;
}

Assistant:

void Write(T&& t, U&& u, Args&&... args) {
    Write(std::forward<T>(t));
    Write(std::forward<U>(u));
    Write(std::forward<Args>(args)...);
  }